

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O1

UINT8 __thiscall PlayerA::Start(PlayerA *this)

{
  PlayerBase *pPVar1;
  UINT8 UVar2;
  INT32 IVar3;
  int iVar4;
  int iVar5;
  
  pPVar1 = this->_player;
  if (pPVar1 == (PlayerBase *)0x0) {
    UVar2 = 0xff;
  }
  else {
    (*pPVar1->_vptr_PlayerBase[0xf])(pPVar1,(ulong)this->_smplRate);
    (*this->_player->_vptr_PlayerBase[0x11])((this->_config).pbSpeed);
    IVar3 = CalcSongVolume(this);
    this->_songVolume = IVar3;
    this->_fadeSmplStart = 0xffffffff;
    this->_endSilenceStart = 0xffffffff;
    iVar4 = (*this->_player->_vptr_PlayerBase[0x1f])();
    iVar5 = (*this->_player->_vptr_PlayerBase[0x19])();
    this->_myPlayState = (byte)iVar5 & 3;
    UVar2 = (UINT8)iVar4;
  }
  return UVar2;
}

Assistant:

UINT8 PlayerA::Start(void)
{
	if (_player == NULL)
		return 0xFF;
	_player->SetSampleRate(_smplRate);
	_player->SetPlaybackSpeed(_config.pbSpeed);
	_songVolume = CalcSongVolume();
	_fadeSmplStart = (UINT32)-1;
	_endSilenceStart = (UINT32)-1;
	
	UINT8 retVal = _player->Start();
	_myPlayState = _player->GetState() & (PLAYSTATE_PLAY | PLAYSTATE_END);
	return retVal;
}